

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O1

int Ndr_ObjReadBody(Ndr_Data_t *p,int Obj,int Type)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  
  puVar2 = p->pBody;
  iVar3 = Obj + 1;
  if (iVar3 < (int)(puVar2[Obj] + Obj)) {
    do {
      bVar1 = p->pHead[iVar3];
      if (bVar1 == 0) {
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if ((uint)bVar1 == Type) {
        return puVar2[iVar3];
      }
      uVar4 = 1;
      if (bVar1 < 4) {
        uVar4 = puVar2[iVar3];
      }
      iVar3 = iVar3 + uVar4;
    } while (iVar3 < (int)(puVar2[Obj] + Obj));
  }
  return -1;
}

Assistant:

static inline int Ndr_ObjReadBody( Ndr_Data_t * p, int Obj, int Type )
{
    int Ent;
    Ndr_ObjForEachEntry( p, Obj, Ent )
        if ( Ndr_DataType(p, Ent) == Type )
            return Ndr_DataEntry(p, Ent);
    return -1;
}